

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmGeneratorTarget::FindTargetToLink(cmGeneratorTarget *this,string *name)

{
  bool bVar1;
  TargetType TVar2;
  ostream *poVar3;
  string *psVar4;
  cmake *this_00;
  cmListFileBacktrace local_1f0;
  string local_1d0;
  cmake *local_1b0;
  cmake *cm;
  ostringstream local_198 [8];
  ostringstream e;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *tgt;
  string *name_local;
  cmGeneratorTarget *this_local;
  
  local_20 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,name);
  if (local_20 != (cmGeneratorTarget *)0x0) {
    TVar2 = GetType(local_20);
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(local_20);
      if (!bVar1) {
        local_20 = (cmGeneratorTarget *)0x0;
      }
    }
  }
  if (local_20 != (cmGeneratorTarget *)0x0) {
    TVar2 = GetType(local_20);
    if (TVar2 == OBJECT_LIBRARY) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = std::operator<<((ostream *)local_198,"Target \"");
      psVar4 = GetName_abi_cxx11_(this);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\" links to OBJECT library \"");
      psVar4 = GetName_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,
                      "\" but this is not allowed.  One may link only to STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                     );
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      local_1b0 = this_00;
      std::__cxx11::ostringstream::str();
      GetBacktrace(&local_1f0,this);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d0,&local_1f0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_20 = (cmGeneratorTarget *)0x0;
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
  }
  return local_20;
}

Assistant:

cmGeneratorTarget* cmGeneratorTarget::FindTargetToLink(
  std::string const& name) const
{
  cmGeneratorTarget* tgt =
    this->LocalGenerator->FindGeneratorTargetToUse(name);

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (tgt && tgt->GetType() == cmStateEnums::EXECUTABLE &&
      !tgt->IsExecutableWithExports()) {
    tgt = CM_NULLPTR;
  }

  if (tgt && tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << this->GetName() << "\" links to "
                                           "OBJECT library \""
      << tgt->GetName()
      << "\" but this is not "
         "allowed.  "
         "One may link only to STATIC or SHARED libraries, or to executables "
         "with the ENABLE_EXPORTS property set.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
    tgt = CM_NULLPTR;
  }

  return tgt;
}